

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

Offset<reflection::Object>
reflection::CreateObject
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> fields,
          bool is_struct,int32_t minalign,int32_t bytesize,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,Offset<flatbuffers::String> declaration_file)

{
  Offset<reflection::Object> OVar1;
  undefined1 local_48 [8];
  ObjectBuilder builder_;
  int32_t bytesize_local;
  int32_t minalign_local;
  bool is_struct_local;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::String> declaration_file_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  documentation_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
  attributes_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> fields_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._12_4_ = bytesize;
  ObjectBuilder::ObjectBuilder((ObjectBuilder *)local_48,_fbb);
  ObjectBuilder::add_declaration_file((ObjectBuilder *)local_48,declaration_file);
  ObjectBuilder::add_documentation((ObjectBuilder *)local_48,documentation);
  ObjectBuilder::add_attributes((ObjectBuilder *)local_48,attributes);
  ObjectBuilder::add_bytesize((ObjectBuilder *)local_48,builder_._12_4_);
  ObjectBuilder::add_minalign((ObjectBuilder *)local_48,minalign);
  ObjectBuilder::add_fields((ObjectBuilder *)local_48,fields);
  ObjectBuilder::add_name((ObjectBuilder *)local_48,name);
  ObjectBuilder::add_is_struct((ObjectBuilder *)local_48,is_struct);
  OVar1 = ObjectBuilder::Finish((ObjectBuilder *)local_48);
  return (Offset<reflection::Object>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Object> CreateObject(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::Field>>> fields = 0,
    bool is_struct = false,
    int32_t minalign = 0,
    int32_t bytesize = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    ::flatbuffers::Offset<::flatbuffers::String> declaration_file = 0) {
  ObjectBuilder builder_(_fbb);
  builder_.add_declaration_file(declaration_file);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_bytesize(bytesize);
  builder_.add_minalign(minalign);
  builder_.add_fields(fields);
  builder_.add_name(name);
  builder_.add_is_struct(is_struct);
  return builder_.Finish();
}